

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void chatra::initializeStTables(void)

{
  pair<chatra::NodeType,_chatra::StatementAttributes> *p;
  undefined1 auVar1 [8];
  ulong uVar2;
  long lVar3;
  initializer_list<chatra::StatementPatternElement> __l;
  initializer_list<chatra::StatementPatternElement> __l_00;
  initializer_list<chatra::StatementPatternElement> __l_01;
  initializer_list<chatra::StatementPatternElement> __l_02;
  initializer_list<chatra::StatementPatternElement> __l_03;
  initializer_list<chatra::StatementPatternElement> __l_04;
  initializer_list<chatra::StatementPatternElement> __l_05;
  initializer_list<chatra::StatementPatternElement> __l_06;
  initializer_list<chatra::StatementPatternElement> __l_07;
  initializer_list<chatra::StatementPatternElement> __l_08;
  initializer_list<chatra::StatementPatternElement> __l_09;
  initializer_list<chatra::StatementPatternElement> __l_10;
  initializer_list<chatra::StatementPatternElement> __l_11;
  initializer_list<chatra::StatementPatternElement> __l_12;
  initializer_list<chatra::StatementPatternElement> __l_13;
  initializer_list<chatra::StatementPatternElement> __l_14;
  initializer_list<chatra::StatementPatternElement> __l_15;
  initializer_list<chatra::StatementPatternElement> __l_16;
  initializer_list<std::pair<chatra::NodeType,_chatra::StatementAttributes>_> __l_17;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_1930;
  undefined1 local_1900;
  StatementAttributes local_18f8;
  undefined1 local_18d0;
  StatementAttributes local_18c8;
  undefined1 local_18a0;
  StatementAttributes local_1898;
  undefined1 local_1870;
  StatementAttributes local_1868;
  undefined1 local_1840;
  StatementAttributes local_1838;
  undefined1 local_1810;
  StatementAttributes local_1808;
  undefined1 local_17e0;
  StatementAttributes local_17d8;
  undefined1 local_17b0;
  StatementAttributes local_17a8;
  undefined1 local_1780;
  StatementAttributes local_1778;
  undefined1 local_1750;
  StatementAttributes local_1748;
  undefined1 local_1720;
  StatementAttributes local_1718;
  undefined1 local_16f0;
  StatementAttributes local_16e8;
  undefined1 local_16c0;
  StatementAttributes local_16b8;
  undefined1 local_1690;
  StatementAttributes local_1688;
  undefined1 local_1660;
  StatementAttributes local_1658;
  undefined1 local_1630;
  StatementAttributes local_1628;
  undefined1 local_1600;
  StatementAttributes local_15f8;
  undefined1 local_15d0;
  StatementAttributes local_15c8;
  undefined1 local_15a0;
  StatementAttributes local_1598;
  undefined1 local_1570;
  StatementAttributes local_1568;
  undefined1 local_1540;
  StatementAttributes local_1538;
  undefined1 local_1510;
  StatementAttributes local_1508;
  undefined1 local_14e0;
  StatementAttributes local_14d8;
  StatementAttributes local_14b0;
  StatementAttributes local_1488;
  StatementAttributes local_1460;
  StatementAttributes local_1438;
  StatementPatternElement local_1410;
  undefined8 local_13d8;
  undefined1 local_13d0;
  undefined8 local_13c8;
  undefined1 *local_13c0;
  undefined8 local_13b8;
  undefined1 local_13b0 [8];
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined1 local_1398;
  undefined8 local_1390;
  undefined1 *local_1388;
  undefined8 local_1380;
  undefined1 local_1378 [8];
  undefined8 uStack_1370;
  undefined8 local_1368;
  undefined1 local_1360;
  undefined8 local_1358;
  undefined1 *local_1350;
  undefined8 local_1348;
  undefined1 local_1340 [8];
  undefined8 uStack_1338;
  undefined8 local_1330;
  undefined1 local_1328;
  undefined8 local_1320;
  undefined1 *local_1318;
  undefined8 local_1310;
  undefined1 local_1308 [8];
  undefined8 uStack_1300;
  undefined8 local_12f8;
  undefined1 local_12f0;
  undefined8 local_12e8;
  undefined1 *local_12e0;
  undefined8 local_12d8;
  undefined1 local_12d0 [8];
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined1 local_12b8;
  undefined8 local_12b0;
  undefined1 *local_12a8;
  undefined8 local_12a0;
  undefined1 local_1298 [8];
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined1 local_1280;
  undefined8 local_1278;
  undefined1 *local_1270;
  undefined8 local_1268;
  undefined1 local_1260 [8];
  undefined8 uStack_1258;
  StatementPatternElement local_1250;
  undefined8 local_1218;
  undefined1 local_1210;
  undefined8 local_1208;
  undefined1 *local_1200;
  undefined8 local_11f8;
  undefined1 local_11f0 [8];
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined1 local_11d8;
  undefined8 local_11d0;
  undefined1 *local_11c8;
  undefined8 local_11c0;
  undefined1 local_11b8 [8];
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined1 local_11a0;
  undefined8 local_1198;
  undefined1 *local_1190;
  undefined8 local_1188;
  undefined1 local_1180 [8];
  undefined8 uStack_1178;
  undefined8 local_1170;
  undefined1 local_1168;
  undefined8 local_1160;
  undefined1 *local_1158;
  undefined8 local_1150;
  undefined1 local_1148 [8];
  undefined8 uStack_1140;
  undefined1 *local_1138;
  undefined1 local_1130;
  undefined8 local_1128;
  undefined1 *local_1120;
  undefined8 local_1118;
  undefined1 local_1110 [8];
  undefined8 uStack_1108;
  StatementPatternElement local_1100;
  undefined8 local_10c8;
  undefined1 local_10c0;
  undefined8 local_10b8;
  undefined1 *local_10b0;
  undefined8 local_10a8;
  undefined1 local_10a0 [8];
  undefined8 uStack_1098;
  undefined8 local_1090;
  undefined1 local_1088;
  undefined8 local_1080;
  undefined1 *local_1078;
  undefined8 local_1070;
  undefined1 local_1068 [8];
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined1 local_1050;
  undefined8 local_1048;
  undefined1 *local_1040;
  undefined8 local_1038;
  undefined1 local_1030 [8];
  undefined8 uStack_1028;
  StatementPatternElement local_1020;
  undefined8 local_fe8;
  undefined1 local_fe0;
  undefined8 local_fd8;
  undefined1 *local_fd0;
  undefined8 local_fc8;
  undefined1 local_fc0 [8];
  undefined8 uStack_fb8;
  undefined8 local_fb0;
  undefined1 local_fa8;
  undefined8 local_fa0;
  undefined1 *local_f98;
  undefined8 local_f90;
  undefined1 local_f88 [8];
  undefined8 uStack_f80;
  StatementPatternElement local_f78;
  undefined8 local_f40;
  undefined1 local_f38;
  undefined8 local_f30;
  undefined1 *local_f28;
  undefined8 local_f20;
  undefined1 local_f18 [8];
  undefined8 uStack_f10;
  undefined1 *local_f08;
  undefined1 local_f00;
  undefined8 local_ef8;
  undefined1 *local_ef0;
  undefined8 local_ee8;
  undefined1 local_ee0 [8];
  undefined8 uStack_ed8;
  StatementPatternElement local_ed0;
  undefined8 local_e98;
  undefined1 local_e90;
  undefined8 local_e88;
  undefined1 *local_e80;
  undefined8 local_e78;
  undefined1 local_e70 [8];
  undefined8 uStack_e68;
  StatementPatternElement local_e60;
  undefined8 local_e28;
  undefined1 local_e20;
  undefined8 local_e18;
  undefined1 *local_e10;
  undefined8 local_e08;
  undefined1 local_e00 [8];
  undefined8 uStack_df8;
  StatementAttributes local_df0;
  StatementAttributes local_dc8;
  StatementAttributes local_da0;
  StatementAttributes local_d78;
  StatementAttributes local_d50;
  StatementAttributes local_d28;
  StatementAttributes local_d00;
  StatementAttributes local_cd8;
  StatementAttributes local_cb0;
  StatementAttributes local_c88;
  StatementAttributes local_c60;
  StatementAttributes local_c38;
  StatementAttributes local_c10;
  StatementAttributes local_be8;
  StatementAttributes local_bc0;
  StatementAttributes local_b98;
  StatementAttributes local_b70;
  StatementAttributes local_b48;
  StatementAttributes local_b20;
  StatementAttributes local_af8;
  undefined1 local_ad0 [24];
  _Alloc_hider local_ab8;
  size_type local_ab0;
  char local_aa8 [16];
  undefined1 *local_a98;
  bool local_a90;
  size_t local_a88;
  _Alloc_hider local_a80;
  size_type local_a78;
  char local_a70 [16];
  undefined1 *local_a60;
  bool local_a58;
  size_t local_a50;
  _Alloc_hider local_a48;
  size_type local_a40;
  char local_a38 [16];
  undefined1 *local_a28;
  bool local_a20;
  size_t local_a18;
  _Alloc_hider local_a10;
  size_type local_a08;
  char local_a00 [16];
  undefined1 *local_9f0;
  bool local_9e8;
  size_t local_9e0;
  _Alloc_hider local_9d8;
  size_type local_9d0;
  char local_9c8 [16];
  undefined1 *local_9b8;
  bool local_9b0;
  size_t local_9a8;
  _Alloc_hider local_9a0;
  size_type local_998;
  char local_990 [16];
  undefined1 *local_980;
  bool local_978;
  size_t local_970;
  _Alloc_hider local_968;
  size_type local_960;
  char local_958 [16];
  undefined1 local_948 [24];
  _Alloc_hider local_930;
  size_type local_928;
  char local_920 [16];
  undefined1 local_910 [24];
  _Alloc_hider local_8f8;
  size_type local_8f0;
  char local_8e8 [16];
  undefined1 local_8d8 [24];
  _Alloc_hider local_8c0;
  size_type local_8b8;
  char local_8b0 [16];
  undefined1 *local_8a0;
  bool local_898;
  size_t local_890;
  _Alloc_hider local_888;
  size_type local_880;
  char local_878 [16];
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_868;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_848;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_828;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_808;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_7e8;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_7c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7b0;
  size_type local_7a8;
  char local_7a0 [8];
  undefined8 uStack_798;
  undefined1 *local_790;
  undefined8 local_788;
  undefined1 local_780 [8];
  undefined8 uStack_778;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_770;
  size_type local_768;
  char local_760 [8];
  undefined8 uStack_758;
  undefined1 *local_750;
  undefined8 local_748;
  undefined1 local_740 [8];
  undefined8 uStack_738;
  undefined1 *local_730;
  undefined8 local_728;
  undefined1 local_720 [8];
  undefined8 uStack_718;
  undefined1 *local_710;
  undefined8 local_708;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined1 *local_6f0;
  undefined8 local_6e8;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  undefined1 *local_6d0;
  undefined8 local_6c8;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 *local_6b0;
  undefined8 local_6a8;
  undefined1 local_6a0 [8];
  undefined8 uStack_698;
  undefined1 *local_690;
  undefined8 local_688;
  undefined1 local_680 [8];
  undefined8 uStack_678;
  char *local_670;
  size_type local_668;
  char local_660 [8];
  undefined8 uStack_658;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_650;
  size_type local_648;
  char local_640 [8];
  undefined8 uStack_638;
  undefined1 *local_630;
  undefined8 local_628;
  undefined1 local_620 [8];
  undefined8 uStack_618;
  undefined1 *local_610;
  undefined8 local_608;
  undefined1 local_600 [8];
  undefined8 uStack_5f8;
  undefined1 *local_5f0;
  undefined8 local_5e8;
  undefined1 local_5e0 [8];
  undefined8 uStack_5d8;
  char *local_5d0;
  size_type local_5c8;
  char local_5c0 [8];
  undefined8 uStack_5b8;
  char *local_5b0;
  size_type local_5a8;
  char local_5a0 [8];
  undefined8 uStack_598;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_590;
  size_type local_588;
  char local_580 [8];
  undefined8 uStack_578;
  undefined1 *local_570;
  undefined8 local_568;
  undefined1 local_560 [8];
  undefined8 uStack_558;
  undefined1 *local_550;
  undefined8 local_548;
  undefined1 local_540 [8];
  undefined8 uStack_538;
  char *local_530;
  size_type local_528;
  char local_520 [8];
  undefined8 uStack_518;
  char *local_510;
  size_type local_508;
  char local_500 [8];
  undefined8 uStack_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4f0;
  size_type local_4e8;
  char local_4e0 [8];
  undefined8 uStack_4d8;
  undefined1 *local_4d0;
  undefined8 local_4c8;
  undefined1 local_4c0 [8];
  undefined8 uStack_4b8;
  undefined1 *local_4b0;
  undefined8 local_4a8;
  undefined1 local_4a0 [8];
  undefined8 uStack_498;
  undefined1 *local_490;
  undefined8 local_488;
  undefined1 local_480 [8];
  undefined8 uStack_478;
  undefined1 *local_470;
  undefined8 local_468;
  undefined1 local_460 [8];
  undefined8 uStack_458;
  undefined1 *local_450;
  undefined8 local_448;
  undefined1 local_440 [8];
  undefined8 uStack_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_430;
  size_type local_428;
  char local_420 [8];
  undefined8 uStack_418;
  undefined1 *local_410;
  undefined8 local_408;
  undefined1 local_400 [8];
  undefined8 uStack_3f8;
  undefined1 *local_3f0;
  undefined8 local_3e8;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  char *local_3d0;
  size_type local_3c8;
  char local_3c0 [8];
  undefined8 uStack_3b8;
  char *local_3b0;
  size_type local_3a8;
  char local_3a0 [8];
  undefined8 uStack_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_390;
  size_type local_388;
  char local_380 [8];
  undefined8 uStack_378;
  undefined1 *local_370;
  undefined8 local_368;
  undefined1 local_360 [8];
  undefined8 uStack_358;
  char *local_350;
  size_type local_348;
  char local_340 [8];
  undefined8 uStack_338;
  char *local_330;
  size_type local_328;
  char local_320 [8];
  undefined8 uStack_318;
  char *local_310;
  size_type local_308;
  char local_300 [8];
  undefined8 uStack_2f8;
  char *local_2f0;
  size_type local_2e8;
  char local_2e0 [8];
  undefined8 uStack_2d8;
  undefined1 local_2d0 [8];
  vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
  sourceForStAttrs;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_298;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_278;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_258;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_238;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_218;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1f8;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1d8;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1b8;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_198;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_178;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_158;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_138;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_118;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_> local_f8
  ;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_> local_d8
  ;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_> local_b8
  ;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_> local_98
  ;
  allocator local_72;
  allocator local_71;
  allocator_type local_70;
  allocator local_6f;
  allocator local_6e;
  allocator local_6d;
  allocator local_6c;
  allocator local_6b;
  allocator local_6a;
  allocator local_69;
  allocator local_68;
  allocator_type local_67;
  allocator local_66;
  allocator_type local_65;
  allocator local_64;
  allocator local_63;
  allocator local_62;
  allocator local_61;
  allocator_type local_60;
  allocator local_5f;
  allocator_type local_5e;
  allocator local_5d;
  allocator_type local_5c;
  allocator local_5b;
  allocator local_5a;
  allocator local_59;
  allocator_type local_58;
  allocator local_57;
  allocator_type local_56;
  allocator local_55;
  allocator_type local_54;
  allocator local_53;
  allocator local_52;
  allocator local_51;
  allocator local_50;
  allocator local_4f;
  allocator local_4e;
  allocator_type local_4d;
  allocator local_4c;
  allocator local_4b;
  allocator local_4a;
  allocator_type local_49;
  allocator local_48;
  allocator_type local_47;
  allocator local_46;
  allocator_type local_45;
  allocator local_44;
  allocator local_43;
  allocator_type local_42;
  allocator local_41;
  allocator_type local_40;
  allocator local_3f;
  allocator_type local_3e;
  allocator local_3d;
  allocator_type local_3c;
  allocator local_3b;
  allocator_type local_3a;
  allocator_type local_39 [9];
  
  std::__cxx11::string::string((string *)&local_7b0,"",&local_72);
  local_ed0.errorMessage._M_dataplus._M_p = (pointer)&local_ed0.errorMessage.field_2;
  local_ed0.type = LabelWithColon;
  local_ed0.token = Invalid;
  local_ed0.required = false;
  local_ed0.subNodeIndex = 0;
  if (local_7b0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0) {
    local_ed0.errorMessage.field_2._8_8_ = uStack_798;
  }
  else {
    local_ed0.errorMessage._M_dataplus._M_p = (pointer)local_7b0;
  }
  local_ed0.errorMessage._M_string_length = local_7a8;
  local_7a8 = 0;
  local_7a0[0] = '\0';
  local_7b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7a0;
  std::__cxx11::string::string((string *)&local_790,"expected package name",&local_71);
  local_e80 = local_e70;
  local_e98 = 0xffffffff00000001;
  local_e90 = 1;
  local_e88 = 1;
  if (local_790 == local_780) {
    uStack_e68 = uStack_778;
  }
  else {
    local_e80 = local_790;
  }
  local_e78 = local_788;
  local_788 = 0;
  local_780[0] = 0;
  __l._M_len = 2;
  __l._M_array = &local_ed0;
  local_790 = local_780;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector((vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
          *)&sourceForStAttrs.
             super__Vector_base<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,__l,&local_70);
  local_df0.subNodes = 2;
  local_df0.skipTokens = 1;
  local_df0.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)sourceForStAttrs.
                super__Vector_base<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  sourceForStAttrs.
  super__Vector_base<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1930.first = Import;
  StatementAttributes::StatementAttributes(&local_1930.second,&local_df0);
  std::__cxx11::string::string((string *)&local_770,"",&local_6f);
  local_1410.errorMessage._M_dataplus._M_p = (pointer)&local_1410.errorMessage.field_2;
  local_1410.type = StorageClassSpecifier;
  local_1410.token = Invalid;
  local_1410.required = false;
  local_1410.subNodeIndex = 0;
  if (local_770 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760) {
    local_1410.errorMessage.field_2._8_8_ = uStack_758;
  }
  else {
    local_1410.errorMessage._M_dataplus._M_p = (pointer)local_770;
  }
  local_1410.errorMessage._M_string_length = local_768;
  local_768 = 0;
  local_760[0] = '\0';
  local_770 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_760;
  std::__cxx11::string::string((string *)&local_750,"",&local_6e);
  local_13c0 = local_13b0;
  local_13d8 = 0xffffffff00000001;
  local_13d0 = 0;
  local_13c8 = 1;
  if (local_750 == local_740) {
    uStack_13a8 = uStack_738;
  }
  else {
    local_13c0 = local_750;
  }
  local_13b8 = local_748;
  local_748 = 0;
  local_740[0] = 0;
  local_750 = local_740;
  std::__cxx11::string::string((string *)&local_730,"",&local_6d);
  local_1388 = local_1378;
  local_13a0 = 0xffffffff00000002;
  local_1398 = 0;
  local_1390 = 2;
  if (local_730 == local_720) {
    uStack_1370 = uStack_718;
  }
  else {
    local_1388 = local_730;
  }
  local_1380 = local_728;
  local_728 = 0;
  local_720[0] = 0;
  local_730 = local_720;
  std::__cxx11::string::string((string *)&local_710,"expected parameter list",&local_6c);
  local_1350 = local_1340;
  local_1368 = 0xffffffff00000008;
  local_1360 = 1;
  local_1358 = 3;
  if (local_710 == local_700) {
    uStack_1338 = uStack_6f8;
  }
  else {
    local_1350 = local_710;
  }
  local_1348 = local_708;
  local_708 = 0;
  local_700[0] = 0;
  local_710 = local_700;
  std::__cxx11::string::string((string *)&local_6f0,"",&local_6b);
  local_1318 = local_1308;
  local_1330 = 0xffffffff00000002;
  local_1328 = 0;
  local_1320 = 4;
  if (local_6f0 == local_6e0) {
    uStack_1300 = uStack_6d8;
  }
  else {
    local_1318 = local_6f0;
  }
  local_1310 = local_6e8;
  local_6e8 = 0;
  local_6e0[0] = 0;
  local_6f0 = local_6e0;
  std::__cxx11::string::string((string *)&local_6d0,"",&local_6a);
  local_12e0 = local_12d0;
  local_12f8 = 0xffffffff00000008;
  local_12f0 = 0;
  local_12e8 = 5;
  if (local_6d0 == local_6c0) {
    uStack_12c8 = uStack_6b8;
  }
  else {
    local_12e0 = local_6d0;
  }
  local_12d8 = local_6c8;
  local_6c8 = 0;
  local_6c0[0] = 0;
  local_6d0 = local_6c0;
  std::__cxx11::string::string((string *)&local_6b0,"",&local_69);
  local_12a8 = local_1298;
  local_12c0 = 0xa00000000;
  local_12b8 = 0;
  local_12b0 = 6;
  if (local_6b0 == local_6a0) {
    uStack_1290 = uStack_698;
  }
  else {
    local_12a8 = local_6b0;
  }
  local_12a0 = local_6a8;
  local_6a8 = 0;
  local_6a0[0] = 0;
  local_6b0 = local_6a0;
  std::__cxx11::string::string((string *)&local_690,"",&local_68);
  local_1270 = local_1260;
  local_1288 = 0xffffffff00000009;
  local_1280 = 0;
  local_1278 = 7;
  if (local_690 == local_680) {
    uStack_1258 = uStack_678;
  }
  else {
    local_1270 = local_690;
  }
  local_1268 = local_688;
  local_688 = 0;
  local_680[0] = 0;
  __l_00._M_len = 8;
  __l_00._M_array = &local_1410;
  local_690 = local_680;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_298,__l_00,&local_67);
  local_dc8.subNodes = 8;
  local_dc8.skipTokens = 1;
  local_dc8.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_298.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_dc8.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_298.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_dc8.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_298.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_298.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1900 = 3;
  StatementAttributes::StatementAttributes(&local_18f8,&local_dc8);
  std::__cxx11::string::string((string *)&local_670,"expected operator parameter set",&local_66);
  local_ab8._M_p = local_aa8;
  local_ad0._0_4_ = OperatorParameter;
  local_ad0._4_4_ = Invalid;
  local_ad0[8] = true;
  local_ad0._16_8_ = 0;
  if (local_670 == local_660) {
    local_aa8[8] = (undefined1)uStack_658;
    local_aa8[9] = uStack_658._1_1_;
    local_aa8[10] = uStack_658._2_1_;
    local_aa8[0xb] = uStack_658._3_1_;
    local_aa8[0xc] = uStack_658._4_1_;
    local_aa8[0xd] = uStack_658._5_1_;
    local_aa8[0xe] = uStack_658._6_1_;
    local_aa8[0xf] = uStack_658._7_1_;
  }
  else {
    local_ab8._M_p = local_670;
  }
  local_ab0 = local_668;
  local_668 = 0;
  local_660[0] = '\0';
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_ad0;
  local_670 = local_660;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_278,__l_01,&local_65);
  local_da0.subNodes = 1;
  local_da0.skipTokens = 2;
  local_da0.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_278.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_da0.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_278.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_da0.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_278.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_278.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18d0 = 4;
  StatementAttributes::StatementAttributes(&local_18c8,&local_da0);
  std::__cxx11::string::string((string *)&local_650,"",&local_64);
  local_1100.errorMessage._M_dataplus._M_p = (pointer)&local_1100.errorMessage.field_2;
  local_1100.type = StorageClassSpecifier;
  local_1100.token = Invalid;
  local_1100.required = false;
  local_1100.subNodeIndex = 0;
  if (local_650 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640) {
    local_1100.errorMessage.field_2._8_8_ = uStack_638;
  }
  else {
    local_1100.errorMessage._M_dataplus._M_p = (pointer)local_650;
  }
  local_1100.errorMessage._M_string_length = local_648;
  local_648 = 0;
  local_640[0] = '\0';
  local_650 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_640;
  std::__cxx11::string::string((string *)&local_630,"expected class name",&local_63);
  local_10b0 = local_10a0;
  local_10c8 = 0xffffffff00000001;
  local_10c0 = 1;
  local_10b8 = 1;
  if (local_630 == local_620) {
    uStack_1098 = uStack_618;
  }
  else {
    local_10b0 = local_630;
  }
  local_10a8 = local_628;
  local_628 = 0;
  local_620[0] = 0;
  local_630 = local_620;
  std::__cxx11::string::string((string *)&local_610,"",&local_62);
  local_1078 = local_1068;
  local_1090 = 0xe00000000;
  local_1088 = 0;
  local_1080 = 2;
  if (local_610 == local_600) {
    uStack_1060 = uStack_5f8;
  }
  else {
    local_1078 = local_610;
  }
  local_1070 = local_608;
  local_608 = 0;
  local_600[0] = 0;
  local_610 = local_600;
  std::__cxx11::string::string((string *)&local_5f0,"",&local_61);
  local_1040 = local_1030;
  local_1058 = 0xffffffff0000000a;
  local_1050 = 0;
  local_1048 = 3;
  if (local_5f0 == local_5e0) {
    uStack_1028 = uStack_5d8;
  }
  else {
    local_1040 = local_5f0;
  }
  local_1038 = local_5e8;
  local_5e8 = 0;
  local_5e0[0] = 0;
  __l_02._M_len = 4;
  __l_02._M_array = &local_1100;
  local_5f0 = local_5e0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_258,__l_02,&local_60);
  local_d78.subNodes = 4;
  local_d78.skipTokens = 1;
  local_d78.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_258.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_d78.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_258.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_d78.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_258.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_258.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18a0 = 5;
  StatementAttributes::StatementAttributes(&local_1898,&local_d78);
  std::__cxx11::string::string((string *)&local_5d0,"expected expression",&local_5f);
  local_a80._M_p = local_a70;
  local_a98 = &DAT_ffffffff00000006;
  local_a90 = true;
  local_a88 = 0;
  if (local_5d0 == local_5c0) {
    local_a70[8] = (undefined1)uStack_5b8;
    local_a70[9] = uStack_5b8._1_1_;
    local_a70[10] = uStack_5b8._2_1_;
    local_a70[0xb] = uStack_5b8._3_1_;
    local_a70[0xc] = uStack_5b8._4_1_;
    local_a70[0xd] = uStack_5b8._5_1_;
    local_a70[0xe] = uStack_5b8._6_1_;
    local_a70[0xf] = uStack_5b8._7_1_;
  }
  else {
    local_a80._M_p = local_5d0;
  }
  local_a78 = local_5c8;
  local_5c8 = 0;
  local_5c0[0] = '\0';
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&local_a98;
  local_5d0 = local_5c0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_238,__l_03,&local_5e);
  local_d50.subNodes = 1;
  local_d50.skipTokens = 0;
  local_d50.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_238.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_d50.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_238.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_d50.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_238.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_238.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1870 = 6;
  StatementAttributes::StatementAttributes(&local_1868,&local_d50);
  local_d28.subNodes = 0;
  local_d28.skipTokens = 1;
  local_d28.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_868.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d28.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d28.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_868.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_868.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1840 = 7;
  StatementAttributes::StatementAttributes(&local_1838,&local_d28);
  std::__cxx11::string::string((string *)&local_5b0,"expected expression",&local_5d);
  local_a48._M_p = local_a38;
  local_a60 = &DAT_ffffffff00000006;
  local_a58 = true;
  local_a50 = 0;
  if (local_5b0 == local_5a0) {
    local_a38[8] = (undefined1)uStack_598;
    local_a38[9] = uStack_598._1_1_;
    local_a38[10] = uStack_598._2_1_;
    local_a38[0xb] = uStack_598._3_1_;
    local_a38[0xc] = uStack_598._4_1_;
    local_a38[0xd] = uStack_598._5_1_;
    local_a38[0xe] = uStack_598._6_1_;
    local_a38[0xf] = uStack_598._7_1_;
  }
  else {
    local_a48._M_p = local_5b0;
  }
  local_a40 = local_5a8;
  local_5a8 = 0;
  local_5a0[0] = '\0';
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&local_a60;
  local_5b0 = local_5a0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_218,__l_04,&local_5c);
  local_d00.subNodes = 1;
  local_d00.skipTokens = 1;
  local_d00.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_218.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_d00.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_218.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_d00.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_218.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_218.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1810 = 8;
  StatementAttributes::StatementAttributes(&local_1808,&local_d00);
  std::__cxx11::string::string((string *)&local_590,"",&local_5b);
  local_1020.errorMessage._M_dataplus._M_p = (pointer)&local_1020.errorMessage.field_2;
  local_1020.type = StorageClassSpecifier;
  local_1020.token = Invalid;
  local_1020.required = false;
  local_1020.subNodeIndex = 0;
  if (local_590 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580) {
    local_1020.errorMessage.field_2._8_8_ = uStack_578;
  }
  else {
    local_1020.errorMessage._M_dataplus._M_p = (pointer)local_590;
  }
  local_1020.errorMessage._M_string_length = local_588;
  local_588 = 0;
  local_580[0] = '\0';
  local_590 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_580;
  std::__cxx11::string::string((string *)&local_570,"expected variable definitions",&local_5a);
  local_fd0 = local_fc0;
  local_fe8 = 0xffffffff0000000b;
  local_fe0 = 1;
  local_fd8 = 1;
  if (local_570 == local_560) {
    uStack_fb8 = uStack_558;
  }
  else {
    local_fd0 = local_570;
  }
  local_fc8 = local_568;
  local_568 = 0;
  local_560[0] = 0;
  local_570 = local_560;
  std::__cxx11::string::string((string *)&local_550,"",&local_59);
  local_f98 = local_f88;
  local_fb0 = 0xffffffff00000009;
  local_fa8 = 0;
  local_fa0 = 2;
  if (local_550 == local_540) {
    uStack_f80 = uStack_538;
  }
  else {
    local_f98 = local_550;
  }
  local_f90 = local_548;
  local_548 = 0;
  local_540[0] = 0;
  __l_05._M_len = 3;
  __l_05._M_array = &local_1020;
  local_550 = local_540;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1f8,__l_05,&local_58);
  local_cd8.subNodes = 3;
  local_cd8.skipTokens = 1;
  local_cd8.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1f8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_cd8.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1f8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_cd8.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1f8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1f8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_17e0 = 9;
  StatementAttributes::StatementAttributes(&local_17d8,&local_cd8);
  local_af8.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_af8.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_af8.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_848.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_af8.subNodes = 0;
  local_af8.skipTokens = 0;
  local_848.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_848.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_17b0 = 10;
  StatementAttributes::StatementAttributes(&local_17a8,&local_af8);
  std::__cxx11::string::string((string *)&local_530,"expected expression",&local_57);
  local_a10._M_p = local_a00;
  local_a28 = &DAT_ffffffff00000006;
  local_a20 = true;
  local_a18 = 0;
  if (local_530 == local_520) {
    local_a00[8] = (undefined1)uStack_518;
    local_a00[9] = uStack_518._1_1_;
    local_a00[10] = uStack_518._2_1_;
    local_a00[0xb] = uStack_518._3_1_;
    local_a00[0xc] = uStack_518._4_1_;
    local_a00[0xd] = uStack_518._5_1_;
    local_a00[0xe] = uStack_518._6_1_;
    local_a00[0xf] = uStack_518._7_1_;
  }
  else {
    local_a10._M_p = local_530;
  }
  local_a08 = local_528;
  local_528 = 0;
  local_520[0] = '\0';
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&local_a28;
  local_530 = local_520;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1d8,__l_06,&local_56);
  local_cb0.subNodes = 1;
  local_cb0.skipTokens = 1;
  local_cb0.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1d8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_cb0.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1d8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_cb0.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1d8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1d8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1780 = 0xb;
  StatementAttributes::StatementAttributes(&local_1778,&local_cb0);
  std::__cxx11::string::string((string *)&local_510,"expected expression",&local_55);
  local_9d8._M_p = local_9c8;
  local_9f0 = &DAT_ffffffff00000006;
  local_9e8 = true;
  local_9e0 = 0;
  if (local_510 == local_500) {
    local_9c8[8] = (undefined1)uStack_4f8;
    local_9c8[9] = uStack_4f8._1_1_;
    local_9c8[10] = uStack_4f8._2_1_;
    local_9c8[0xb] = uStack_4f8._3_1_;
    local_9c8[0xc] = uStack_4f8._4_1_;
    local_9c8[0xd] = uStack_4f8._5_1_;
    local_9c8[0xe] = uStack_4f8._6_1_;
    local_9c8[0xf] = uStack_4f8._7_1_;
  }
  else {
    local_9d8._M_p = local_510;
  }
  local_9d0 = local_508;
  local_508 = 0;
  local_500[0] = '\0';
  __l_07._M_len = 1;
  __l_07._M_array = (iterator)&local_9f0;
  local_510 = local_500;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1b8,__l_07,&local_54);
  local_c88.subNodes = 1;
  local_c88.skipTokens = 2;
  local_c88.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1b8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_c88.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1b8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_c88.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1b8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1b8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1750 = 0xc;
  StatementAttributes::StatementAttributes(&local_1748,&local_c88);
  local_c60.subNodes = 0;
  local_c60.skipTokens = 1;
  local_c60.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_828.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c60.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c60.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_828.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_828.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1720 = 0xd;
  StatementAttributes::StatementAttributes(&local_1718,&local_c60);
  std::__cxx11::string::string((string *)&local_4f0,"",&local_53);
  local_1250.errorMessage._M_dataplus._M_p = (pointer)&local_1250.errorMessage.field_2;
  local_1250.type = LabelWithColon;
  local_1250.token = Invalid;
  local_1250.required = false;
  local_1250.subNodeIndex = 1;
  if (local_4f0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0) {
    local_1250.errorMessage.field_2._8_8_ = uStack_4d8;
  }
  else {
    local_1250.errorMessage._M_dataplus._M_p = (pointer)local_4f0;
  }
  local_1250.errorMessage._M_string_length = local_4e8;
  local_4e8 = 0;
  local_4e0[0] = '\0';
  local_4f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e0;
  std::__cxx11::string::string((string *)&local_4d0,"",&local_52);
  local_1200 = local_11f0;
  local_1218 = 0x1400000000;
  local_1210 = 1;
  local_1208 = 0xffffffffffffffff;
  if (local_4d0 == local_4c0) {
    uStack_11e8 = uStack_4b8;
  }
  else {
    local_1200 = local_4d0;
  }
  local_11f8 = local_4c8;
  local_4c8 = 0;
  local_4c0[0] = 0;
  local_4d0 = local_4c0;
  std::__cxx11::string::string((string *)&local_4b0,"",&local_51);
  local_11c8 = local_11b8;
  local_11e0 = 0xffffffff00000004;
  local_11d8 = 0;
  local_11d0 = 2;
  if (local_4b0 == local_4a0) {
    uStack_11b0 = uStack_498;
  }
  else {
    local_11c8 = local_4b0;
  }
  local_11c0 = local_4a8;
  local_4a8 = 0;
  local_4a0[0] = 0;
  local_4b0 = local_4a0;
  std::__cxx11::string::string((string *)&local_490,"",&local_50);
  local_1190 = local_1180;
  local_11a8 = 0xffffffff0000000c;
  local_11a0 = 0;
  local_1198 = 0;
  if (local_490 == local_480) {
    uStack_1178 = uStack_478;
  }
  else {
    local_1190 = local_490;
  }
  local_1188 = local_488;
  local_488 = 0;
  local_480[0] = 0;
  local_490 = local_480;
  std::__cxx11::string::string((string *)&local_470,"expected \"in\"",&local_4f);
  local_1158 = local_1148;
  local_1170 = 0x1500000000;
  local_1168 = 1;
  local_1160 = 0xffffffffffffffff;
  if (local_470 == local_460) {
    uStack_1140 = uStack_458;
  }
  else {
    local_1158 = local_470;
  }
  local_1150 = local_468;
  local_468 = 0;
  local_460[0] = 0;
  local_470 = local_460;
  std::__cxx11::string::string((string *)&local_450,"expected expression",&local_4e);
  local_1120 = local_1110;
  local_1138 = &DAT_ffffffff00000006;
  local_1130 = 1;
  local_1128 = 3;
  if (local_450 == local_440) {
    uStack_1108 = uStack_438;
  }
  else {
    local_1120 = local_450;
  }
  local_1118 = local_448;
  local_448 = 0;
  local_440[0] = 0;
  __l_08._M_len = 6;
  __l_08._M_array = &local_1250;
  local_450 = local_440;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_198,__l_08,&local_4d);
  local_c38.subNodes = 4;
  local_c38.skipTokens = 0;
  local_c38.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_198.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_c38.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_198.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_c38.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_198.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_198.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16f0 = 0xe;
  StatementAttributes::StatementAttributes(&local_16e8,&local_c38);
  std::__cxx11::string::string((string *)&local_430,"",&local_4c);
  local_f78.errorMessage._M_dataplus._M_p = (pointer)&local_f78.errorMessage.field_2;
  local_f78.type = LabelWithColon;
  local_f78.token = Invalid;
  local_f78.required = false;
  local_f78.subNodeIndex = 0;
  if (local_430 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420) {
    local_f78.errorMessage.field_2._8_8_ = uStack_418;
  }
  else {
    local_f78.errorMessage._M_dataplus._M_p = (pointer)local_430;
  }
  local_f78.errorMessage._M_string_length = local_428;
  local_428 = 0;
  local_420[0] = '\0';
  local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_420;
  std::__cxx11::string::string((string *)&local_410,"",&local_4b);
  local_f28 = local_f18;
  local_f40 = 0x1600000000;
  local_f38 = 1;
  local_f30 = 0xffffffffffffffff;
  if (local_410 == local_400) {
    uStack_f10 = uStack_3f8;
  }
  else {
    local_f28 = local_410;
  }
  local_f20 = local_408;
  local_408 = 0;
  local_400[0] = 0;
  local_410 = local_400;
  std::__cxx11::string::string((string *)&local_3f0,"expected expression",&local_4a);
  local_ef0 = local_ee0;
  local_f08 = &DAT_ffffffff00000006;
  local_f00 = 1;
  local_ef8 = 1;
  if (local_3f0 == local_3e0) {
    uStack_ed8 = uStack_3d8;
  }
  else {
    local_ef0 = local_3f0;
  }
  local_ee8 = local_3e8;
  local_3e8 = 0;
  local_3e0[0] = 0;
  __l_09._M_len = 3;
  __l_09._M_array = &local_f78;
  local_3f0 = local_3e0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_178,__l_09,&local_49);
  local_c10.subNodes = 2;
  local_c10.skipTokens = 0;
  local_c10.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_178.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_c10.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_178.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_c10.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_178.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_178.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16c0 = 0xf;
  StatementAttributes::StatementAttributes(&local_16b8,&local_c10);
  std::__cxx11::string::string((string *)&local_3d0,"expected expression",&local_48);
  local_9a0._M_p = local_990;
  local_9b8 = &DAT_ffffffff00000006;
  local_9b0 = true;
  local_9a8 = 0;
  if (local_3d0 == local_3c0) {
    local_990[8] = (undefined1)uStack_3b8;
    local_990[9] = uStack_3b8._1_1_;
    local_990[10] = uStack_3b8._2_1_;
    local_990[0xb] = uStack_3b8._3_1_;
    local_990[0xc] = uStack_3b8._4_1_;
    local_990[0xd] = uStack_3b8._5_1_;
    local_990[0xe] = uStack_3b8._6_1_;
    local_990[0xf] = uStack_3b8._7_1_;
  }
  else {
    local_9a0._M_p = local_3d0;
  }
  local_998 = local_3c8;
  local_3c8 = 0;
  local_3c0[0] = '\0';
  __l_10._M_len = 1;
  __l_10._M_array = (iterator)&local_9b8;
  local_3d0 = local_3c0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_158,__l_10,&local_47);
  local_be8.subNodes = 1;
  local_be8.skipTokens = 1;
  local_be8.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_158.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_be8.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_158.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_be8.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_158.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_158.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1690 = 0x10;
  StatementAttributes::StatementAttributes(&local_1688,&local_be8);
  std::__cxx11::string::string((string *)&local_3b0,"expected expression",&local_46);
  local_968._M_p = local_958;
  local_980 = &DAT_ffffffff00000006;
  local_978 = true;
  local_970 = 0;
  if (local_3b0 == local_3a0) {
    local_958[8] = (undefined1)uStack_398;
    local_958[9] = uStack_398._1_1_;
    local_958[10] = uStack_398._2_1_;
    local_958[0xb] = uStack_398._3_1_;
    local_958[0xc] = uStack_398._4_1_;
    local_958[0xd] = uStack_398._5_1_;
    local_958[0xe] = uStack_398._6_1_;
    local_958[0xf] = uStack_398._7_1_;
  }
  else {
    local_968._M_p = local_3b0;
  }
  local_960 = local_3a8;
  local_3a8 = 0;
  local_3a0[0] = '\0';
  __l_11._M_len = 1;
  __l_11._M_array = (iterator)&local_980;
  local_3b0 = local_3a0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_138,__l_11,&local_45);
  local_bc0.subNodes = 1;
  local_bc0.skipTokens = 1;
  local_bc0.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_138.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_bc0.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_138.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_bc0.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_138.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_138.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1660 = 0x11;
  StatementAttributes::StatementAttributes(&local_1658,&local_bc0);
  local_b98.subNodes = 0;
  local_b98.skipTokens = 1;
  local_b98.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_808.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b98.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b98.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_808.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_808.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1630 = 0x12;
  StatementAttributes::StatementAttributes(&local_1628,&local_b98);
  local_b70.subNodes = 0;
  local_b70.skipTokens = 1;
  local_b70.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7e8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b70.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b70.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7e8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7e8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1600 = 0x13;
  StatementAttributes::StatementAttributes(&local_15f8,&local_b70);
  std::__cxx11::string::string((string *)&local_390,"",&local_44);
  local_e60.errorMessage._M_dataplus._M_p = (pointer)&local_e60.errorMessage.field_2;
  local_e60.type = LabelWithColon;
  local_e60.token = Invalid;
  local_e60.required = false;
  local_e60.subNodeIndex = 0;
  if (local_390 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380) {
    local_e60.errorMessage.field_2._8_8_ = uStack_378;
  }
  else {
    local_e60.errorMessage._M_dataplus._M_p = (pointer)local_390;
  }
  local_e60.errorMessage._M_string_length = local_388;
  local_388 = 0;
  local_380[0] = '\0';
  local_390 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380;
  std::__cxx11::string::string((string *)&local_370,"expected exception-class list",&local_43);
  local_e10 = local_e00;
  local_e28 = 0xffffffff0000000a;
  local_e20 = 1;
  local_e18 = 1;
  if (local_370 == local_360) {
    uStack_df8 = uStack_358;
  }
  else {
    local_e10 = local_370;
  }
  local_e08 = local_368;
  local_368 = 0;
  local_360[0] = 0;
  __l_12._M_len = 2;
  __l_12._M_array = &local_e60;
  local_370 = local_360;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_118,__l_12,&local_42);
  local_b48.subNodes = 2;
  local_b48.skipTokens = 1;
  local_b48.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_118.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_b48.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_118.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_b48.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_118.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_118.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15d0 = 0x14;
  StatementAttributes::StatementAttributes(&local_15c8,&local_b48);
  local_b20.subNodes = 0;
  local_b20.skipTokens = 1;
  local_b20.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7c8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b20.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b20.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7c8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7c8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15a0 = 0x15;
  StatementAttributes::StatementAttributes(&local_1598,&local_b20);
  std::__cxx11::string::string((string *)&local_350,"",&local_41);
  local_930._M_p = local_920;
  local_948._0_4_ = Label;
  local_948._4_4_ = Invalid;
  local_948[8] = false;
  local_948._16_8_ = 0;
  if (local_350 == local_340) {
    local_920[8] = (undefined1)uStack_338;
    local_920[9] = uStack_338._1_1_;
    local_920[10] = uStack_338._2_1_;
    local_920[0xb] = uStack_338._3_1_;
    local_920[0xc] = uStack_338._4_1_;
    local_920[0xd] = uStack_338._5_1_;
    local_920[0xe] = uStack_338._6_1_;
    local_920[0xf] = uStack_338._7_1_;
  }
  else {
    local_930._M_p = local_350;
  }
  local_928 = local_348;
  local_348 = 0;
  local_340[0] = '\0';
  __l_13._M_len = 1;
  __l_13._M_array = (iterator)local_948;
  local_350 = local_340;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_f8,__l_13,&local_40);
  local_14b0.subNodes = 1;
  local_14b0.skipTokens = 1;
  local_14b0.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_f8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_14b0.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_f8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_14b0.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_f8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1570 = 0x16;
  StatementAttributes::StatementAttributes(&local_1568,&local_14b0);
  std::__cxx11::string::string((string *)&local_330,"",&local_3f);
  local_8f8._M_p = local_8e8;
  local_910._0_4_ = Label;
  local_910._4_4_ = Invalid;
  local_910[8] = false;
  local_910._16_8_ = 0;
  if (local_330 == local_320) {
    local_8e8[8] = (undefined1)uStack_318;
    local_8e8[9] = uStack_318._1_1_;
    local_8e8[10] = uStack_318._2_1_;
    local_8e8[0xb] = uStack_318._3_1_;
    local_8e8[0xc] = uStack_318._4_1_;
    local_8e8[0xd] = uStack_318._5_1_;
    local_8e8[0xe] = uStack_318._6_1_;
    local_8e8[0xf] = uStack_318._7_1_;
  }
  else {
    local_8f8._M_p = local_330;
  }
  local_8f0 = local_328;
  local_328 = 0;
  local_320[0] = '\0';
  __l_14._M_len = 1;
  __l_14._M_array = (iterator)local_910;
  local_330 = local_320;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_d8,__l_14,&local_3e);
  local_1488.subNodes = 1;
  local_1488.skipTokens = 1;
  local_1488.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_d8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1488.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_d8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1488.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_d8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1540 = 0x17;
  StatementAttributes::StatementAttributes(&local_1538,&local_1488);
  std::__cxx11::string::string((string *)&local_310,"",&local_3d);
  local_8c0._M_p = local_8b0;
  local_8d8._0_4_ = TupleExpression;
  local_8d8._4_4_ = Invalid;
  local_8d8[8] = false;
  local_8d8._16_8_ = 0;
  if (local_310 == local_300) {
    local_8b0[8] = (undefined1)uStack_2f8;
    local_8b0[9] = uStack_2f8._1_1_;
    local_8b0[10] = uStack_2f8._2_1_;
    local_8b0[0xb] = uStack_2f8._3_1_;
    local_8b0[0xc] = uStack_2f8._4_1_;
    local_8b0[0xd] = uStack_2f8._5_1_;
    local_8b0[0xe] = uStack_2f8._6_1_;
    local_8b0[0xf] = uStack_2f8._7_1_;
  }
  else {
    local_8c0._M_p = local_310;
  }
  local_8b8 = local_308;
  local_308 = 0;
  local_300[0] = '\0';
  __l_15._M_len = 1;
  __l_15._M_array = (iterator)local_8d8;
  local_310 = local_300;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_b8,__l_15,&local_3c);
  local_1460.subNodes = 1;
  local_1460.skipTokens = 1;
  local_1460.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_b8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1460.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_b8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1460.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_b8.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1510 = 0x18;
  StatementAttributes::StatementAttributes(&local_1508,&local_1460);
  std::__cxx11::string::string((string *)&local_2f0,"",&local_3b);
  local_888._M_p = local_878;
  local_8a0 = &DAT_ffffffff00000006;
  local_898 = false;
  local_890 = 0;
  if (local_2f0 == local_2e0) {
    local_878[8] = (undefined1)uStack_2d8;
    local_878[9] = uStack_2d8._1_1_;
    local_878[10] = uStack_2d8._2_1_;
    local_878[0xb] = uStack_2d8._3_1_;
    local_878[0xc] = uStack_2d8._4_1_;
    local_878[0xd] = uStack_2d8._5_1_;
    local_878[0xe] = uStack_2d8._6_1_;
    local_878[0xf] = uStack_2d8._7_1_;
  }
  else {
    local_888._M_p = local_2f0;
  }
  local_880 = local_2e8;
  local_2e8 = 0;
  local_2e0[0] = '\0';
  __l_16._M_len = 1;
  __l_16._M_array = (iterator)&local_8a0;
  local_2f0 = local_2e0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_98,__l_16,&local_3a);
  local_1438.subNodes = 1;
  local_1438.skipTokens = 1;
  local_1438.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_98.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1438.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_98.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1438.pattern.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_98.
       super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14e0 = 0x19;
  StatementAttributes::StatementAttributes(&local_14d8,&local_1438);
  __l_17._M_len = 0x18;
  __l_17._M_array = &local_1930;
  std::
  vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
  ::vector((vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
            *)local_2d0,__l_17,local_39);
  lVar3 = 0x468;
  do {
    std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
    ~vector((vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
             *)(&local_1930.first + lVar3));
    lVar3 = lVar3 + -0x30;
  } while (lVar3 != -0x18);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1438.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_98);
  std::__cxx11::string::~string((string *)&local_888);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1460.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_b8);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string((string *)&local_310);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1488.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_d8);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&local_330);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_14b0.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_f8);
  std::__cxx11::string::~string((string *)&local_930);
  std::__cxx11::string::~string((string *)&local_350);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_b20.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_7c8);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_b48.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_118);
  lVar3 = 0x50;
  do {
    std::__cxx11::string::~string((string *)((long)&local_e60.type + lVar3));
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != -0x20);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_390);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_b70.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_7e8);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_b98.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_808);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_bc0.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_138);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_be8.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_158);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_c10.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_178);
  lVar3 = 0x88;
  do {
    std::__cxx11::string::~string((string *)((long)&local_f78.type + lVar3));
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != -0x20);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_c38.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_198);
  lVar3 = 0x130;
  do {
    std::__cxx11::string::~string((string *)((long)&local_1250.type + lVar3));
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != -0x20);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_c60.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_828);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_c88.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1b8);
  std::__cxx11::string::~string((string *)&local_9d8);
  std::__cxx11::string::~string((string *)&local_510);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_cb0.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1d8);
  std::__cxx11::string::~string((string *)&local_a10);
  std::__cxx11::string::~string((string *)&local_530);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_af8.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_848);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_cd8.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1f8);
  lVar3 = 0x88;
  do {
    std::__cxx11::string::~string((string *)((long)&local_1020.type + lVar3));
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != -0x20);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_590);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_d00.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_218);
  std::__cxx11::string::~string((string *)&local_a48);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_d28.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_868);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_d50.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_238);
  std::__cxx11::string::~string((string *)&local_a80);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_d78.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_258);
  lVar3 = 0xc0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_1100.type + lVar3));
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != -0x20);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_650);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_da0.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_278);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::__cxx11::string::~string((string *)&local_670);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_dc8.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_298);
  lVar3 = 0x1a0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_1410.type + lVar3));
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != -0x20);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::~string((string *)&local_770);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_df0.pattern);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector((vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
           *)&sourceForStAttrs.
              super__Vector_base<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  lVar3 = 0x50;
  do {
    std::__cxx11::string::~string((string *)((long)&local_ed0.type + lVar3));
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != -0x20);
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_7b0);
  uVar2 = 0;
  for (auVar1 = local_2d0;
      auVar1 != (undefined1  [8])
                sourceForStAttrs.
                super__Vector_base<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar1 = (undefined1  [8])((long)auVar1 + 0x30)) {
    if (uVar2 <= ((pointer)auVar1)->first) {
      uVar2 = (ulong)((pointer)auVar1)->first;
    }
  }
  std::vector<chatra::StatementAttributes,_std::allocator<chatra::StatementAttributes>_>::resize
            ((vector<chatra::StatementAttributes,_std::allocator<chatra::StatementAttributes>_> *)
             stAttrs,uVar2 + 1);
  for (auVar1 = local_2d0;
      auVar1 != (undefined1  [8])
                sourceForStAttrs.
                super__Vector_base<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar1 = (undefined1  [8])((long)auVar1 + 0x30)) {
    StatementAttributes::operator=
              ((StatementAttributes *)((ulong)((pointer)auVar1)->first * 0x28 + stAttrs._0_8_),
               &((pointer)auVar1)->second);
  }
  std::
  vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
  ::~vector((vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
             *)local_2d0);
  return;
}

Assistant:

static void initializeStTables() {
	const std::vector<std::pair<NodeType, StatementAttributes>> sourceForStAttrs = {
			{NodeType::Import, {SubNode::Import_SubNodes, 1, {
					{StPt::LabelWithColon, StringId::Invalid, false, SubNode::Import_Alias},
					{StPt::Name, StringId::Invalid, true, SubNode::Import_Package, "expected package name"}
			}}},
			{NodeType::Def, {SubNode::Def_SubNodes, 1, {
					{StPt::StorageClassSpecifier, StringId::Invalid, false, SubNode::Def_Static},
					{StPt::Name, StringId::Invalid, false, SubNode::Def_Name},
					{StPt::VariationName, StringId::Invalid, false, SubNode::Def_Variation},
					{StPt::ParameterList, StringId::Invalid, true, SubNode::Def_Parameter, "expected parameter list"},
					{StPt::VariationName, StringId::Invalid, false, SubNode::Def_Operator},
					{StPt::ParameterList, StringId::Invalid, false, SubNode::Def_OperatorParameter},
					{StPt::Token, StringId::Delete, false, SubNode::Def_Delete},
					{StPt::Qualifiers, StringId::Invalid, false, SubNode::Def_Qualifiers}
			}}},
			{NodeType::DefOperator, {1, 2, {
					{StPt::OperatorParameter, StringId::Invalid, true, 0, "expected operator parameter set"}
			}}},
			{NodeType::Class, {SubNode::Class_SubNodes, 1, {
					{StPt::StorageClassSpecifier, StringId::Invalid, false, SubNode::Class_Static},
					{StPt::Name, StringId::Invalid, true, SubNode::Class_Name, "expected class name"},
					{StPt::Token, StringId::Extends, false, SubNode::Class_Extends},
					{StPt::ClassList, StringId::Invalid, false, SubNode::Class_BaseClassList}
			}}},
			{NodeType::Expression, {1, 0, {
					{StPt::Expression, StringId::Invalid, true, 0, "expected expression"}
			}}},
			{NodeType::Sync, {0, 1, {}}},
			{NodeType::Touch, {1, 1, {
					{StPt::Expression, StringId::Invalid, true, 0, "expected expression"}
			}}},
			{NodeType::Var, {SubNode::Var_SubNodes, 1, {
					{StPt::StorageClassSpecifier, StringId::Invalid, false, SubNode::Var_Static},
					{StPt::VarDefinitions, StringId::Invalid, true, SubNode::Var_Definitions, "expected variable definitions"},
					{StPt::Qualifiers, StringId::Invalid, false, SubNode::Var_Qualifiers}
			}}},
			{NodeType::IfGroup, {0, 0, {}}},
			{NodeType::If, {1, 1, {
					{StPt::Expression, StringId::Invalid, true, 0, "expected expression"}
			}}},
			{NodeType::ElseIf, {1, 2, {
					{StPt::Expression, StringId::Invalid, true, 0, "expected expression"}
			}}},
			{NodeType::Else, {0, 1, {}}},
			{NodeType::For, {SubNode::For_SubNodes, 0, {
					{StPt::LabelWithColon, StringId::Invalid, false, SubNode::For_Label},
					{StPt::Token, StringId::For, true, SIZE_MAX  /* internal error */},
					{StPt::LabelWithColon, StringId::Invalid, false, SubNode::For_Iterator},
					{StPt::ForLoopVariables, StringId::Invalid, false, SubNode::For_LoopVariable},
					{StPt::Token, StringId::In, true, SIZE_MAX, "expected \"in\""},
					{StPt::Expression, StringId::Invalid, true, SubNode::For_Iterable, "expected expression"}
			}}},
			{NodeType::While, {SubNode::While_SubNodes, 0, {
					{StPt::LabelWithColon, StringId::Invalid, false, SubNode::While_Label},
					{StPt::Token, StringId::While, true, SIZE_MAX  /* internal error */},
					{StPt::Expression, StringId::Invalid, true, SubNode::While_Condition, "expected expression"}
			}}},
			{NodeType::Switch, {1, 1, {
					{StPt::Expression, StringId::Invalid, true, 0, "expected expression"}
			}}},
			{NodeType::Case, {1, 1, {
					{StPt::Expression, StringId::Invalid, true, 0, "expected expression"}
			}}},
			{NodeType::Default, {0, 1, {}}},
			{NodeType::Do, {0, 1, {}}},
			{NodeType::Catch, {SubNode::Catch_SubNodes, 1, {
					{StPt::LabelWithColon, StringId::Invalid, false, SubNode::Catch_Label},
					{StPt::ClassList, StringId::Invalid, true, SubNode::Catch_ClassList, "expected exception-class list"}
			}}},
			{NodeType::Finally, {0, 1, {}}},
			{NodeType::Break, {1, 1, {
					{StPt::Label, StringId::Invalid, false, 0}
			}}},
			{NodeType::Continue, {1, 1, {
					{StPt::Label, StringId::Invalid, false, 0}
			}}},
			{NodeType::Return, {1, 1, {
					{StPt::TupleExpression, StringId::Invalid, false, 0}
			}}},
			{NodeType::Throw, {1, 1, {
					{StPt::Expression, StringId::Invalid, false, 0}
			}}}
	};

	size_t maxIndex = 0;
	for (auto& p : sourceForStAttrs)
		maxIndex = std::max(maxIndex, static_cast<size_t>(p.first));
	stAttrs.resize(maxIndex + 1);
	for (auto& p : sourceForStAttrs)
		stAttrs[static_cast<size_t>(p.first)] = p.second;
}